

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleShapeEx.cpp
# Opt level: O1

int __thiscall
cbtPrimitiveTriangle::clip_triangle
          (cbtPrimitiveTriangle *this,cbtPrimitiveTriangle *other,cbtVector3 *clipped_points)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  cbtVector3 *e0;
  float fVar10;
  cbtVector4 edgeplane;
  cbtVector3 temp_points1 [16];
  cbtVector3 temp_points [16];
  cbtVector4 local_238;
  cbtVector3 local_228 [16];
  cbtVector3 local_128 [16];
  
  fVar3 = this->m_vertices[1].m_floats[0] - this->m_vertices[0].m_floats[0];
  fVar4 = this->m_vertices[1].m_floats[1] - this->m_vertices[0].m_floats[1];
  fVar5 = this->m_vertices[1].m_floats[2] - this->m_vertices[0].m_floats[2];
  fVar10 = (this->m_plane).super_cbtVector3.m_floats[2];
  fVar1 = (this->m_plane).super_cbtVector3.m_floats[1];
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar5)),ZEXT416((uint)fVar4),ZEXT416((uint)fVar10)
                          );
  fVar2 = (this->m_plane).super_cbtVector3.m_floats[0];
  auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar3)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar5)
                          );
  fVar10 = auVar7._0_4_;
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar4)),ZEXT416((uint)fVar3),ZEXT416((uint)fVar1))
  ;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar6,auVar6);
  auVar7 = vfmadd231ss_fma(auVar7,auVar8,auVar8);
  if (auVar7._0_4_ < 0.0) {
    local_238.super_cbtVector3.m_floats[2] = sqrtf(auVar7._0_4_);
  }
  else {
    auVar7 = vsqrtss_avx(auVar7,auVar7);
    local_238.super_cbtVector3.m_floats[2] = auVar7._0_4_;
  }
  local_238.super_cbtVector3.m_floats[2] = 1.0 / local_238.super_cbtVector3.m_floats[2];
  local_238.super_cbtVector3.m_floats[0] = auVar6._0_4_ * local_238.super_cbtVector3.m_floats[2];
  local_238.super_cbtVector3.m_floats[1] = fVar10 * local_238.super_cbtVector3.m_floats[2];
  local_238.super_cbtVector3.m_floats[2] = local_238.super_cbtVector3.m_floats[2] * auVar8._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_238.super_cbtVector3.m_floats[1] *
                                         this->m_vertices[1].m_floats[1])),
                           ZEXT416((uint)local_238.super_cbtVector3.m_floats[0]),
                           ZEXT416((uint)this->m_vertices[1].m_floats[0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_238.super_cbtVector3.m_floats[2]),
                           ZEXT416((uint)this->m_vertices[1].m_floats[2]));
  local_238.super_cbtVector3.m_floats[3] = auVar7._0_4_;
  iVar9 = bt_plane_clip_triangle
                    (&local_238,other->m_vertices,other->m_vertices + 1,other->m_vertices + 2,
                     local_128);
  if (iVar9 != 0) {
    fVar3 = this->m_vertices[2].m_floats[0] - this->m_vertices[1].m_floats[0];
    fVar4 = this->m_vertices[2].m_floats[1] - this->m_vertices[1].m_floats[1];
    fVar5 = this->m_vertices[2].m_floats[2] - this->m_vertices[1].m_floats[2];
    fVar10 = (this->m_plane).super_cbtVector3.m_floats[2];
    fVar1 = (this->m_plane).super_cbtVector3.m_floats[1];
    auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar5)),ZEXT416((uint)fVar4),
                             ZEXT416((uint)fVar10));
    fVar2 = (this->m_plane).super_cbtVector3.m_floats[0];
    auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar3)),ZEXT416((uint)fVar2),
                             ZEXT416((uint)fVar5));
    fVar10 = auVar7._0_4_;
    auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar4)),ZEXT416((uint)fVar3),
                             ZEXT416((uint)fVar1));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar6,auVar6);
    auVar7 = vfmadd231ss_fma(auVar7,auVar8,auVar8);
    if (auVar7._0_4_ < 0.0) {
      local_238.super_cbtVector3.m_floats[2] = sqrtf(auVar7._0_4_);
    }
    else {
      auVar7 = vsqrtss_avx(auVar7,auVar7);
      local_238.super_cbtVector3.m_floats[2] = auVar7._0_4_;
    }
    local_238.super_cbtVector3.m_floats[2] = 1.0 / local_238.super_cbtVector3.m_floats[2];
    local_238.super_cbtVector3.m_floats[0] = auVar6._0_4_ * local_238.super_cbtVector3.m_floats[2];
    local_238.super_cbtVector3.m_floats[1] = fVar10 * local_238.super_cbtVector3.m_floats[2];
    local_238.super_cbtVector3.m_floats[2] = local_238.super_cbtVector3.m_floats[2] * auVar8._0_4_;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_238.super_cbtVector3.m_floats[1] *
                                           this->m_vertices[2].m_floats[1])),
                             ZEXT416((uint)local_238.super_cbtVector3.m_floats[0]),
                             ZEXT416((uint)this->m_vertices[2].m_floats[0]));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_238.super_cbtVector3.m_floats[2]),
                             ZEXT416((uint)this->m_vertices[2].m_floats[2]));
    local_238.super_cbtVector3.m_floats[3] = auVar7._0_4_;
    iVar9 = bt_plane_clip_polygon(&local_238,local_128,iVar9,local_228);
    if (iVar9 != 0) {
      fVar3 = this->m_vertices[0].m_floats[0] - this->m_vertices[2].m_floats[0];
      fVar4 = this->m_vertices[0].m_floats[1] - this->m_vertices[2].m_floats[1];
      fVar5 = this->m_vertices[0].m_floats[2] - this->m_vertices[2].m_floats[2];
      fVar10 = (this->m_plane).super_cbtVector3.m_floats[2];
      fVar1 = (this->m_plane).super_cbtVector3.m_floats[1];
      auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar5)),ZEXT416((uint)fVar4),
                               ZEXT416((uint)fVar10));
      fVar2 = (this->m_plane).super_cbtVector3.m_floats[0];
      auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar3)),ZEXT416((uint)fVar2),
                               ZEXT416((uint)fVar5));
      fVar10 = auVar7._0_4_;
      auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar4)),ZEXT416((uint)fVar3),
                               ZEXT416((uint)fVar1));
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar6,auVar6);
      auVar7 = vfmadd231ss_fma(auVar7,auVar8,auVar8);
      if (auVar7._0_4_ < 0.0) {
        local_238.super_cbtVector3.m_floats[2] = sqrtf(auVar7._0_4_);
      }
      else {
        auVar7 = vsqrtss_avx(auVar7,auVar7);
        local_238.super_cbtVector3.m_floats[2] = auVar7._0_4_;
      }
      local_238.super_cbtVector3.m_floats[2] = 1.0 / local_238.super_cbtVector3.m_floats[2];
      local_238.super_cbtVector3.m_floats[0] = auVar6._0_4_ * local_238.super_cbtVector3.m_floats[2]
      ;
      local_238.super_cbtVector3.m_floats[1] = fVar10 * local_238.super_cbtVector3.m_floats[2];
      local_238.super_cbtVector3.m_floats[2] = local_238.super_cbtVector3.m_floats[2] * auVar8._0_4_
      ;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_238.super_cbtVector3.m_floats[1] *
                                             this->m_vertices[0].m_floats[1])),
                               ZEXT416((uint)local_238.super_cbtVector3.m_floats[0]),
                               ZEXT416((uint)this->m_vertices[0].m_floats[0]));
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_238.super_cbtVector3.m_floats[2]),
                               ZEXT416((uint)this->m_vertices[0].m_floats[2]));
      local_238.super_cbtVector3.m_floats[3] = auVar7._0_4_;
      iVar9 = bt_plane_clip_polygon(&local_238,local_228,iVar9,clipped_points);
      return iVar9;
    }
  }
  return 0;
}

Assistant:

int cbtPrimitiveTriangle::clip_triangle(cbtPrimitiveTriangle& other, cbtVector3* clipped_points)
{
	// edge 0

	cbtVector3 temp_points[MAX_TRI_CLIPPING];

	cbtVector4 edgeplane;

	get_edge_plane(0, edgeplane);

	int clipped_count = bt_plane_clip_triangle(
		edgeplane, other.m_vertices[0], other.m_vertices[1], other.m_vertices[2], temp_points);

	if (clipped_count == 0) return 0;

	cbtVector3 temp_points1[MAX_TRI_CLIPPING];

	// edge 1
	get_edge_plane(1, edgeplane);

	clipped_count = bt_plane_clip_polygon(edgeplane, temp_points, clipped_count, temp_points1);

	if (clipped_count == 0) return 0;

	// edge 2
	get_edge_plane(2, edgeplane);

	clipped_count = bt_plane_clip_polygon(
		edgeplane, temp_points1, clipped_count, clipped_points);

	return clipped_count;
}